

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ast.cpp
# Opt level: O2

void __thiscall PrintAST::visit(PrintAST *this,PrintNode *node)

{
  ExpListNode *pEVar1;
  uint uVar2;
  
  printAST(this,"PRINT_LN");
  uVar2 = this->level;
  this->level = uVar2 + 1;
  pEVar1 = node->list;
  if (pEVar1 != (ExpListNode *)0x0) {
    (*(pEVar1->super_ASTNode)._vptr_ASTNode[3])(pEVar1,this);
    uVar2 = this->level - 1;
  }
  this->level = uVar2;
  return;
}

Assistant:

void PrintAST::visit(PrintNode *node) {
    this->printAST("PRINT_LN");
    up_level();
    if (node->getExpList() != nullptr) {
        node->getExpList()->accept(this);
    }
    down_level();
}